

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O3

FxExpression * ParseParameter(FScanner *sc,PClassActor *cls,PType *type,bool constant)

{
  PClassActor *pPVar1;
  char *_statestring;
  PInt *pPVar2;
  PName *pPVar3;
  PColor *pPVar4;
  PStatePointer *pPVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  FxMultiNameState *this;
  FxExpression *pFVar10;
  FxFloatCast *this_00;
  FxBoolCast *this_01;
  FxRuntimeStateIndex *this_02;
  FScriptPosition *other;
  PName **ppPVar11;
  undefined1 local_60 [16];
  FScriptPosition local_50;
  ExpVal local_40;
  PClass *pPVar9;
  
  if ((PType *)TypeSound == type) {
    FScanner::MustGetString(sc);
    this = (FxMultiNameState *)operator_new(0x48);
    iVar7 = S_FindSound(sc->String);
    FScriptPosition::FScriptPosition((FScriptPosition *)local_60,sc);
    FxExpression::FxExpression((FxExpression *)this,(FScriptPosition *)local_60);
    ppPVar11 = (PName **)&TypeSound;
LAB_0069bcc1:
    (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
    pPVar1 = (PClassActor *)*ppPVar11;
    this->scope = pPVar1;
    (this->super_FxExpression).ValueType = (PType *)pPVar1;
    *(int *)&(this->names).Array = iVar7;
LAB_0069bcde:
    (this->super_FxExpression).isresolved = true;
  }
  else {
    if ((((PType *)TypeBool == type) || ((PType *)TypeSInt32 == type)) ||
       ((PType *)TypeFloat64 == type)) {
      pFVar10 = ParseExpression(sc,cls,constant);
      if ((constant) && (iVar7 = (*pFVar10->_vptr_FxExpression[3])(pFVar10), (char)iVar7 == '\0')) {
        FScanner::ScriptMessage(sc,"Default parameter must be constant.");
        FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
      }
      pPVar2 = TypeSInt32;
      if ((PType *)TypeBool != type) {
        this_00 = (FxFloatCast *)operator_new(0x40);
        if ((PType *)pPVar2 != type) {
          FxFloatCast::FxFloatCast(this_00,pFVar10);
          return &this_00->super_FxExpression;
        }
        FxIntCast::FxIntCast((FxIntCast *)this_00,pFVar10);
        return &this_00->super_FxExpression;
      }
      this_01 = (FxBoolCast *)operator_new(0x40);
      FxBoolCast::FxBoolCast(this_01,pFVar10);
      return &this_01->super_FxExpression;
    }
    ppPVar11 = &TypeName;
    if (((PType *)TypeName == type) || ((PType *)TypeString == type)) {
      FScanner::SetEscape(sc,true);
      FScanner::MustGetString(sc);
      iVar7 = 0;
      FScanner::SetEscape(sc,false);
      pPVar3 = TypeName;
      this = (FxMultiNameState *)operator_new(0x48);
      if ((PType *)pPVar3 != type) {
        strbin1((char *)&local_50);
        FScriptPosition::FScriptPosition((FScriptPosition *)local_60,sc);
        FxConstant::FxConstant((FxConstant *)this,&local_50.FileName,(FScriptPosition *)local_60);
        FString::~FString((FString *)local_60);
        other = &local_50;
        goto LAB_0069bce7;
      }
      if (*sc->String != '\0') {
        iVar7 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
      }
      FScriptPosition::FScriptPosition((FScriptPosition *)local_60,sc);
      FxExpression::FxExpression((FxExpression *)this,(FScriptPosition *)local_60);
      goto LAB_0069bcc1;
    }
    if ((PType *)TypeColor == type) {
      FScanner::MustGetString(sc);
      bVar6 = FScanner::Compare(sc,"none");
      local_60._8_4_ = 0xffffffff;
      if (!bVar6) {
        bVar6 = FScanner::Compare(sc,(char *)"");
        local_60._8_4_ = 0;
        if (!bVar6) {
          uVar8 = V_GetColor((DWORD *)0x0,sc->String);
          local_60._8_4_ = uVar8 & 0xffffff | 0x1000000;
        }
      }
      pPVar4 = TypeColor;
      other = (FScriptPosition *)(local_60 + 8);
      local_60._0_8_ = TypeColor;
      this = (FxMultiNameState *)operator_new(0x48);
      local_40.Type = (PType *)pPVar4;
      if ((PString *)pPVar4 == TypeString) {
        FString::AttachToOther((FString *)&local_40.field_1,(FString *)other);
      }
      else {
        local_40.field_1._4_4_ = local_60._12_4_;
        local_40.field_1.Int = local_60._8_4_;
      }
      FScriptPosition::FScriptPosition(&local_50,sc);
      FxConstant::FxConstant((FxConstant *)this,&local_40,&local_50);
      FString::~FString(&local_50.FileName);
      if (local_40.Type == (PType *)TypeString) {
        FString::~FString((FString *)&local_40.field_1);
      }
      if ((PString *)local_60._0_8_ != TypeString) {
        return &this->super_FxExpression;
      }
      goto LAB_0069bce7;
    }
    if ((PType *)TypeState == type) {
      bVar6 = FScanner::CheckToken(sc,0x102);
      if (!bVar6) {
        if (constant) {
          FScanner::MustGetToken(sc,0x102);
          return (FxExpression *)0x0;
        }
        this_02 = (FxRuntimeStateIndex *)operator_new(0x40);
        pFVar10 = ParseExpression(sc,cls,false);
        FxRuntimeStateIndex::FxRuntimeStateIndex(this_02,pFVar10);
        return &this_02->super_FxExpression;
      }
      if ((*sc->String == '\0') || (bVar6 = FScanner::Compare(sc,"None"), bVar6)) {
        this = (FxMultiNameState *)operator_new(0x48);
        FScriptPosition::FScriptPosition((FScriptPosition *)local_60,sc);
        FxExpression::FxExpression((FxExpression *)this,(FScriptPosition *)local_60);
        (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
        (this->names).Array = (FName *)0x0;
      }
      else {
        bVar6 = FScanner::Compare(sc,"*");
        if (!bVar6) {
          this = (FxMultiNameState *)operator_new(0x50);
          _statestring = sc->String;
          FScriptPosition::FScriptPosition((FScriptPosition *)local_60,sc);
          FxMultiNameState::FxMultiNameState(this,_statestring,(FScriptPosition *)local_60);
          goto LAB_0069bce2;
        }
        if (!constant) {
          FScanner::ScriptError(sc,"Invalid state name \'*\'");
          return (FxExpression *)0x0;
        }
        this = (FxMultiNameState *)operator_new(0x48);
        FScriptPosition::FScriptPosition((FScriptPosition *)local_60,sc);
        FxExpression::FxExpression((FxExpression *)this,(FScriptPosition *)local_60);
        (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
        (this->names).Array = (FName *)0xffffffffffffffff;
      }
      pPVar5 = TypeState;
      this->scope = (PClassActor *)TypeState;
      (this->super_FxExpression).ValueType = (PType *)pPVar5;
      goto LAB_0069bcde;
    }
    pPVar9 = (type->super_DObject).Class;
    if (pPVar9 == (PClass *)0x0) {
      iVar7 = (**(type->super_DObject)._vptr_DObject)(type);
      pPVar9 = (PClass *)CONCAT44(extraout_var,iVar7);
      (type->super_DObject).Class = pPVar9;
    }
    if (pPVar9 != PClassPointer::RegistrationInfo.MyClass) {
      __assert_fail("false && \"Unknown parameter type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_parse.cpp"
                    ,0xaf,"FxExpression *ParseParameter(FScanner &, PClassActor *, PType *, bool)");
    }
    FScanner::SetEscape(sc,true);
    FScanner::MustGetString(sc);
    FScanner::SetEscape(sc,false);
    this = (FxMultiNameState *)operator_new(0x48);
    pPVar9 = type[1].super_DObject.Class;
    pFVar10 = (FxExpression *)operator_new(0x48);
    iVar7 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
    FScriptPosition::FScriptPosition((FScriptPosition *)local_60,sc);
    FxExpression::FxExpression(pFVar10,(FScriptPosition *)local_60);
    pFVar10->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
    pPVar3 = TypeName;
    pFVar10[1]._vptr_FxExpression = (_func_int **)TypeName;
    pFVar10->ValueType = (PType *)pPVar3;
    *(int *)&pFVar10[1].JumpAddresses.Array = iVar7;
    pFVar10->isresolved = true;
    FxClassTypeCast::FxClassTypeCast((FxClassTypeCast *)this,pPVar9,pFVar10);
  }
LAB_0069bce2:
  other = (FScriptPosition *)local_60;
LAB_0069bce7:
  FString::~FString(&other->FileName);
  return &this->super_FxExpression;
}

Assistant:

FxExpression *ParseParameter(FScanner &sc, PClassActor *cls, PType *type, bool constant)
{
	FxExpression *x = NULL;
	int v;

	if (type == TypeSound)
	{
		sc.MustGetString();
		x = new FxConstant(FSoundID(sc.String), sc);
	}
	else if (type == TypeBool || type == TypeSInt32 || type == TypeFloat64)
	{
		x = ParseExpression (sc, cls, constant);
		if (constant && !x->isConstant())
		{
			sc.ScriptMessage("Default parameter must be constant.");
			FScriptPosition::ErrorCounter++;
		}
		// Do automatic coercion between bools, ints and floats.
		if (type == TypeBool)
		{
			x = new FxBoolCast(x);
		}
		else if (type == TypeSInt32)
		{
			x = new FxIntCast(x);
		}
		else
		{
			x = new FxFloatCast(x);
		}
	}
	else if (type == TypeName || type == TypeString)
	{
		sc.SetEscape(true);
		sc.MustGetString();
		sc.SetEscape(false);
		if (type == TypeName)
		{
			x = new FxConstant(sc.String[0] ? FName(sc.String) : NAME_None, sc);
		}
		else
		{
			x = new FxConstant(strbin1(sc.String), sc);
		}
	}
	else if (type == TypeColor)
	{
		sc.MustGetString ();
		if (sc.Compare("none"))
		{
			v = -1;
		}
		else if (sc.Compare(""))
		{
			v = 0;
		}
		else
		{
			int c = V_GetColor (NULL, sc.String);
			// 0 needs to be the default so we have to mark the color.
			v = MAKEARGB(1, RPART(c), GPART(c), BPART(c));
		}
		ExpVal val;
		val.Type = TypeColor;
		val.Int = v;
		x = new FxConstant(val, sc);
	}
	else if (type == TypeState)
	{
		// This forces quotation marks around the state name.
		if (sc.CheckToken(TK_StringConst))
		{
			if (sc.String[0] == 0 || sc.Compare("None"))
			{
				x = new FxConstant((FState*)NULL, sc);
			}
			else if (sc.Compare("*"))
			{
				if (constant)
				{
					x = new FxConstant((FState*)(intptr_t)-1, sc);
				}
				else sc.ScriptError("Invalid state name '*'");
			}
			else
			{
				x = new FxMultiNameState(sc.String, sc);
			}
		}
		else if (!constant)
		{
			x = new FxRuntimeStateIndex(ParseExpression(sc, cls));
		}
		else sc.MustGetToken(TK_StringConst); // This is for the error.
	}
	else if (type->GetClass() == RUNTIME_CLASS(PClassPointer))
	{	// Actor name
		sc.SetEscape(true);
		sc.MustGetString();
		sc.SetEscape(false);
		x = new FxClassTypeCast(static_cast<PClassPointer *>(type)->ClassRestriction, new FxConstant(FName(sc.String), sc));
	}
	else
	{
		assert(false && "Unknown parameter type");
		x = NULL;
	}
	return x;
}